

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

int str_end_cmp(st_data_t ax,st_data_t ay)

{
  byte *pbStack_40;
  int c;
  OnigUChar *q;
  OnigUChar *p;
  st_str_end_key *y;
  st_str_end_key *x;
  st_data_t ay_local;
  st_data_t ax_local;
  
  if (*(long *)(ax + 8) - *(long *)ax == *(long *)(ay + 8) - *(long *)ay) {
    pbStack_40 = *(byte **)ay;
    for (q = *(OnigUChar **)ax; q < *(OnigUChar **)(ax + 8); q = q + 1) {
      if ((uint)*q - (uint)*pbStack_40 != 0) {
        return (uint)*q - (uint)*pbStack_40;
      }
      pbStack_40 = pbStack_40 + 1;
    }
    ax_local._4_4_ = 0;
  }
  else {
    ax_local._4_4_ = 1;
  }
  return ax_local._4_4_;
}

Assistant:

static int
str_end_cmp(st_data_t ax, st_data_t ay)
{
  st_str_end_key* x = (st_str_end_key* )ax;
  st_str_end_key* y = (st_str_end_key* )ay;
  UChar *p, *q;
  int c;

  if ((x->end - x->s) != (y->end - y->s))
    return 1;

  p = x->s;
  q = y->s;
  while (p < x->end) {
    c = (int )*p - (int )*q;
    if (c != 0) return c;

    p++; q++;
  }

  return 0;
}